

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O3

bool __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::is_defined(tag_t<cfgfile::string_trait_t> *this)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  undefined8 *puVar5;
  
  iVar3 = (*this->_vptr_tag_t[2])();
  puVar5 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  bVar4 = 1;
  do {
    if (puVar5 == puVar1) {
LAB_00117c71:
      return (bool)(bVar4 & this->m_is_defined);
    }
    if (((tag_t<cfgfile::string_trait_t> *)*puVar5)->m_is_mandatory == true) {
      bVar2 = is_defined((tag_t<cfgfile::string_trait_t> *)*puVar5);
      if (!bVar2) {
        bVar4 = 0;
        goto LAB_00117c71;
      }
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

bool is_defined() const
	{
		for( const tag_t< Trait > * tag : children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				return false;
		}

		return m_is_defined;
	}